

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O0

vector<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>,_std::allocator<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>_>
* __thiscall
tinyusdz::usdc::USDCReader::Impl::DecodeListOp<tinyusdz::Path>
          (vector<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>,_std::allocator<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>_>
           *__return_storage_ptr__,Impl *this,ListOp<tinyusdz::Path> *arg)

{
  bool bVar1;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *pvVar2;
  size_type sVar3;
  ListEditQual local_13c;
  pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>
  local_138;
  ListEditQual local_114;
  pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>
  local_110;
  ListEditQual local_ec;
  pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>
  local_e8;
  ListEditQual local_c4;
  pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>
  local_c0;
  ListEditQual local_9c;
  pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>
  local_98;
  ListEditQual local_74;
  pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>
  local_70;
  ListEditQual local_4c;
  pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>
  local_48;
  undefined1 local_21;
  ListOp<tinyusdz::Path> *local_20;
  ListOp<tinyusdz::Path> *arg_local;
  Impl *this_local;
  vector<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>,_std::allocator<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>_>
  *dst;
  
  local_21 = 0;
  local_20 = arg;
  arg_local = (ListOp<tinyusdz::Path> *)this;
  this_local = (Impl *)__return_storage_ptr__;
  ::std::
  vector<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>,_std::allocator<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>_>
  ::vector(__return_storage_ptr__);
  bVar1 = ListOp<tinyusdz::Path>::IsExplicit(local_20);
  if (bVar1) {
    local_4c = ResetToExplicit;
    pvVar2 = ListOp<tinyusdz::Path>::GetExplicitItems(local_20);
    ::std::
    pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>::
    pair<tinyusdz::ListEditQual,_true>(&local_48,&local_4c,pvVar2);
    ::std::
    vector<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>,_std::allocator<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>_>
    ::push_back(__return_storage_ptr__,&local_48);
    ::std::
    pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>::
    ~pair(&local_48);
  }
  else {
    pvVar2 = ListOp<tinyusdz::Path>::GetExplicitItems(local_20);
    sVar3 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)pvVar2);
    if (sVar3 != 0) {
      local_74 = ResetToExplicit;
      pvVar2 = ListOp<tinyusdz::Path>::GetExplicitItems(local_20);
      ::std::
      pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>::
      pair<tinyusdz::ListEditQual,_true>(&local_70,&local_74,pvVar2);
      ::std::
      vector<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>,_std::allocator<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>_>
      ::push_back(__return_storage_ptr__,&local_70);
      ::std::
      pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>::
      ~pair(&local_70);
    }
    pvVar2 = ListOp<tinyusdz::Path>::GetAddedItems(local_20);
    sVar3 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)pvVar2);
    if (sVar3 != 0) {
      local_9c = Add;
      pvVar2 = ListOp<tinyusdz::Path>::GetAddedItems(local_20);
      ::std::
      pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>::
      pair<tinyusdz::ListEditQual,_true>(&local_98,&local_9c,pvVar2);
      ::std::
      vector<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>,_std::allocator<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>_>
      ::push_back(__return_storage_ptr__,&local_98);
      ::std::
      pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>::
      ~pair(&local_98);
    }
    pvVar2 = ListOp<tinyusdz::Path>::GetAppendedItems(local_20);
    sVar3 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)pvVar2);
    if (sVar3 != 0) {
      local_c4 = Append;
      pvVar2 = ListOp<tinyusdz::Path>::GetAppendedItems(local_20);
      ::std::
      pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>::
      pair<tinyusdz::ListEditQual,_true>(&local_c0,&local_c4,pvVar2);
      ::std::
      vector<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>,_std::allocator<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>_>
      ::push_back(__return_storage_ptr__,&local_c0);
      ::std::
      pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>::
      ~pair(&local_c0);
    }
    pvVar2 = ListOp<tinyusdz::Path>::GetDeletedItems(local_20);
    sVar3 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)pvVar2);
    if (sVar3 != 0) {
      local_ec = Delete;
      pvVar2 = ListOp<tinyusdz::Path>::GetDeletedItems(local_20);
      ::std::
      pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>::
      pair<tinyusdz::ListEditQual,_true>(&local_e8,&local_ec,pvVar2);
      ::std::
      vector<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>,_std::allocator<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>_>
      ::push_back(__return_storage_ptr__,&local_e8);
      ::std::
      pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>::
      ~pair(&local_e8);
    }
    pvVar2 = ListOp<tinyusdz::Path>::GetPrependedItems(local_20);
    sVar3 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)pvVar2);
    if (sVar3 != 0) {
      local_114 = Prepend;
      pvVar2 = ListOp<tinyusdz::Path>::GetPrependedItems(local_20);
      ::std::
      pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>::
      pair<tinyusdz::ListEditQual,_true>(&local_110,&local_114,pvVar2);
      ::std::
      vector<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>,_std::allocator<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>_>
      ::push_back(__return_storage_ptr__,&local_110);
      ::std::
      pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>::
      ~pair(&local_110);
    }
    pvVar2 = ListOp<tinyusdz::Path>::GetOrderedItems(local_20);
    sVar3 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)pvVar2);
    if (sVar3 != 0) {
      local_13c = Order;
      pvVar2 = ListOp<tinyusdz::Path>::GetOrderedItems(local_20);
      ::std::
      pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>::
      pair<tinyusdz::ListEditQual,_true>(&local_138,&local_13c,pvVar2);
      ::std::
      vector<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>,_std::allocator<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>_>
      ::push_back(__return_storage_ptr__,&local_138);
      ::std::
      pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>::
      ~pair(&local_138);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<ListEditQual, std::vector<T>>>
USDCReader::Impl::DecodeListOp(const ListOp<T> &arg) {
  std::vector<std::pair<ListEditQual, std::vector<T>>> dst;

  if (arg.IsExplicit()) {  // fast path
    dst.push_back({ListEditQual::ResetToExplicit, arg.GetExplicitItems()});
  } else {
    // Assume all items have same ListEdit qualifier.
    if (arg.GetExplicitItems().size()) {
      dst.push_back({ListEditQual::ResetToExplicit, arg.GetExplicitItems()});
    }
    if (arg.GetAddedItems().size()) {
      dst.push_back({ListEditQual::Add, arg.GetAddedItems()});
    }
    if (arg.GetAppendedItems().size()) {
      dst.push_back({ListEditQual::Append, arg.GetAppendedItems()});
    }
    if (arg.GetDeletedItems().size()) {
      dst.push_back({ListEditQual::Delete, arg.GetDeletedItems()});
    }
    if (arg.GetPrependedItems().size()) {
      dst.push_back({ListEditQual::Prepend, arg.GetPrependedItems()});
    }
    if (arg.GetOrderedItems().size()) {
      dst.push_back({ListEditQual::Order, arg.GetOrderedItems()});
    }
  }

  return dst;
}